

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<bool> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<bool> PVar1;
  _Bvector_base<std::allocator<bool>_> _Stack_38;
  
  ValueArray<bool,bool>::MakeVector<bool,0ul,1ul>(&_Stack_38);
  ValuesIn<std::vector<bool,std::allocator<bool>>>
            ((testing *)this,(vector<bool,_std::allocator<bool>_> *)&_Stack_38);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&_Stack_38);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<bool>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(std::make_index_sequence<sizeof...(Ts)>()));
  }